

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlist.c
# Opt level: O3

int dlist_insl_after(dlist_head_t *head,dlist_t *dlist,dlist_t *new)

{
  dlist_s *pdVar1;
  
  if (head == (dlist_head_t *)0x0) {
    __assert_fail("head != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/dlist.c",0x74,
                  "int dlist_insl_after(dlist_head_t *, dlist_t *, dlist_t *)");
  }
  if (dlist != (dlist_t *)0x0) {
    if (new != (dlist_t *)0x0) {
      pdVar1 = dlist->next;
      new->next = pdVar1;
      if (pdVar1 != (dlist_s *)0x0) {
        pdVar1->prev = new;
      }
      dlist->next = new;
      new->prev = dlist;
      if (head->end == dlist) {
        head->end = new;
      }
      head->num = head->num + 1;
      return 1;
    }
    __assert_fail("new != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/dlist.c",0x76,
                  "int dlist_insl_after(dlist_head_t *, dlist_t *, dlist_t *)");
  }
  __assert_fail("dlist != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/dlist.c",0x75,
                "int dlist_insl_after(dlist_head_t *, dlist_t *, dlist_t *)");
}

Assistant:

int dlist_insl_after(dlist_head_t *head, dlist_t *dlist, dlist_t *new) {
  assert(head != NULL);
  assert(dlist != NULL);
  assert(new != NULL);

  new->next   = dlist->next;
  if (new->next)
    new->next->prev = new;
  dlist->next = new;
  new->prev   = dlist;
  
  if (dlist == head->end)
    head->end = new;
  
  head->num++;
  
  return 1;
}